

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::cose::Sign1Message::Validate
          (Error *__return_storage_ptr__,Sign1Message *this,mbedtls_pk_context *aPublicKey)

{
  mbedtls_pk_context pk;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  int iVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  undefined8 in_stack_fffffffffffffd20;
  anon_class_1_0_00000001 local_262;
  v10 local_261;
  v10 *local_260;
  size_t local_258;
  string local_250;
  Error local_230;
  anon_class_1_0_00000001 local_202;
  v10 local_201;
  v10 *local_200;
  size_t local_1f8;
  string local_1f0;
  Error local_1d0;
  mbedtls_pk_info_t *local_1a8;
  void *pvStack_1a0;
  undefined8 local_198;
  mbedtls_ecp_keypair *local_180;
  mbedtls_ecp_keypair *eckey;
  mbedtls_pk_context *local_170;
  mbedtls_pk_context *aPublicKey_local;
  Sign1Message *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  eckey._7_1_ = 0;
  local_170 = aPublicKey;
  aPublicKey_local = (mbedtls_pk_context *)this;
  this_local = (Sign1Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  iVar5 = mbedtls_pk_can_do(local_170,MBEDTLS_PK_ECDSA);
  if (iVar5 != 0) {
    local_198 = *(undefined8 *)&local_170->priv_id;
    local_1a8 = local_170->pk_info;
    pvStack_1a0 = local_170->pk_ctx;
    uVar1 = local_170->pk_ctx;
    uVar2 = local_170->priv_id;
    uVar3 = *(undefined4 *)&local_170->field_0x14;
    pk.pk_ctx._4_4_ = uVar3;
    pk.pk_ctx._0_4_ = uVar2;
    pk.pk_info = (mbedtls_pk_info_t *)uVar1;
    pk._16_8_ = in_stack_fffffffffffffd20;
    local_180 = mbedtls_pk_ec(pk);
    if (local_180 != (mbedtls_ecp_keypair *)0x0) {
      _Var4 = COSE_Sign0_validate_eckey
                        (this->mSign,(eckey_t_conflict *)local_180,(cose_errback *)0x0);
      if (_Var4) {
        return __return_storage_ptr__;
      }
      Validate::anon_class_1_0_00000001::operator()(&local_262);
      local_a8 = &local_260;
      local_b0 = &local_261;
      bVar6 = ::fmt::v10::operator()(local_b0);
      local_258 = bVar6.size_;
      local_260 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_250;
      local_120 = local_260;
      sStack_118 = local_258;
      local_80 = &local_120;
      local_130 = local_260;
      local_128 = local_258;
      local_78 = local_130;
      sStack_70 = local_128;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_50 = local_140;
      local_58 = &error;
      local_30 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_58;
      local_48 = local_58;
      local_38 = local_58;
      local_28 = local_50;
      ::fmt::v10::vformat_abi_cxx11_(&local_250,local_130,fmt_00,args_00);
      Error::Error(&local_230,kSecurity,&local_250);
      Error::operator=(__return_storage_ptr__,&local_230);
      Error::~Error(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      return __return_storage_ptr__;
    }
  }
  Validate::anon_class_1_0_00000001::operator()(&local_202);
  local_b8 = &local_200;
  local_c0 = &local_201;
  bVar6 = ::fmt::v10::operator()(local_c0);
  local_1f8 = bVar6.size_;
  local_200 = (v10 *)bVar6.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_c8 = &local_1f0;
  local_d8 = local_200;
  sStack_d0 = local_1f8;
  local_a0 = &local_d8;
  local_e8 = local_200;
  local_e0 = local_1f8;
  local_98 = local_e8;
  sStack_90 = local_e0;
  local_108[0] = ::fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_60 = local_f8;
  local_68 = local_108;
  local_18 = 0;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_e0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_68;
  local_40 = local_68;
  local_20 = local_68;
  local_10 = local_60;
  ::fmt::v10::vformat_abi_cxx11_(&local_1f0,local_e8,fmt,args);
  Error::Error(&local_1d0,kInvalidArgs,&local_1f0);
  Error::operator=(__return_storage_ptr__,&local_1d0);
  Error::~Error(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Validate(const mbedtls_pk_context &aPublicKey)
{
    Error                             error;
    const struct mbedtls_ecp_keypair *eckey;

    // Accepts only EC keys
    VerifyOrExit(mbedtls_pk_can_do(&aPublicKey, MBEDTLS_PK_ECDSA) && (eckey = mbedtls_pk_ec(aPublicKey)) != nullptr,
                 error = ERROR_INVALID_ARGS("validate COSE SIGN1 message without valid EC public key"));

    VerifyOrExit(COSE_Sign0_validate_eckey(mSign, eckey, nullptr),
                 error = ERROR_SECURITY("validate COSE SIGN1 message failed"));

exit:
    return error;
}